

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools.h
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* Parfait::StringTools::split
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *s,string *delimiter)

{
  char *pcVar1;
  long lVar2;
  string local_58 [8];
  string out;
  char *next;
  char *src;
  string *delimiter_local;
  string *s_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *elements;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  next = (char *)std::__cxx11::string::c_str();
  std::__cxx11::string::string(local_58);
  while( true ) {
    pcVar1 = (char *)std::__cxx11::string::c_str();
    pcVar1 = strstr(next,pcVar1);
    if (pcVar1 == (char *)0x0) break;
    while (next != pcVar1) {
      std::__cxx11::string::operator+=(local_58,*next);
      next = next + 1;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)local_58);
    lVar2 = std::__cxx11::string::size();
    next = next + lVar2;
    std::__cxx11::string::operator=(local_58,"");
  }
  while (*next != '\0') {
    std::__cxx11::string::operator+=(local_58,*next);
    next = next + 1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_58);
  std::__cxx11::string::~string(local_58);
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<std::string> split(const std::string &s, const std::string &delimiter) {
        std::vector<std::string> elements;
        auto src = s.c_str();
        const char *next = src;
        std::string out;
        while ((next = strstr(src, delimiter.c_str())) != NULL) {
            while (src != next)
                out += *src++;
            elements.push_back(out);
            src += delimiter.size();
            out = "";
        }

        while (*src != '\0')
            out += *src++;
        elements.push_back(out);
        return elements;
    }